

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# launch.c
# Opt level: O2

void authenticate_and_launch(void)

{
  int iVar1;
  char response [8];
  
  printf("Secret: ");
  gets(response);
  iVar1 = bcmp(response,"Joshua",7);
  if (iVar1 == 0) {
    puts("Access granted");
    launch_missiles(2);
  }
  else {
    puts("Access denied");
  }
  return;
}

Assistant:

void authenticate_and_launch(void) {
  int n_missiles = 2;
  bool allowaccess = false;
  char response[8];

  printf("Secret: ");
  gets(response);

  if (strcmp(response, "Joshua") == 0)
    allowaccess = true;

  if (allowaccess) {
    puts("Access granted");
    launch_missiles(n_missiles);
  }

  if (!allowaccess)
    puts("Access denied");
}